

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O3

void __thiscall
ConditionalEstimator::setParameter(ConditionalEstimator *this,Property *p,double value)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double **ppdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar2 = *p;
  if (iVar2 == 3) {
    this->nDist = (int)value;
  }
  else if (iVar2 == 2) {
    this->aDistRange[1] = value;
  }
  else {
    if (iVar2 != 1) {
      return;
    }
    this->aDistRange[0] = value;
  }
  iVar2 = this->nPost + this->nPre;
  uVar8 = this->nPost + this->nPre + 1;
  ppdVar4 = this->aDist;
  if (ppdVar4 != (double **)0x0) {
    if (-1 < iVar2) {
      uVar6 = 0;
      do {
        if (this->aDist[uVar6] != (double *)0x0) {
          operator_delete__(this->aDist[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      ppdVar4 = this->aDist;
      if (ppdVar4 == (double **)0x0) goto LAB_0012171b;
    }
    operator_delete__(ppdVar4);
  }
LAB_0012171b:
  dVar1 = this->aDistRange[1];
  this->dDistOffset = this->aDistRange[0];
  iVar3 = this->nDist;
  this->dDistScale = (dVar1 - this->aDistRange[0]) / (double)iVar3;
  uVar6 = (long)(int)uVar8 << 3;
  if (iVar2 < -1) {
    uVar6 = 0xffffffffffffffff;
  }
  ppdVar4 = (double **)operator_new__(uVar6);
  this->aDist = ppdVar4;
  if (-1 < iVar2) {
    uVar6 = (long)iVar3 << 3;
    if (iVar3 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar7 = 0;
    do {
      pdVar5 = (double *)operator_new__(uVar6);
      this->aDist[uVar7] = pdVar5;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  return;
}

Assistant:

void ConditionalEstimator::setParameter( const Property& p, double value )
{
	// assign parameter
	if (p==EST_DIST_MIN)
		aDistRange[0] = value;
	else if (p==EST_DIST_MAX)
		aDistRange[1] = value;
	else if (p==EST_DIST_BINS)
		nDist = (int)value;
	else return;
	
	// re-generate distribution
	int size = nPre+nPost+1;
	if (aDist) {
		for( int i=0; i<size; i++ )
			if (aDist[i])
				delete[] aDist[i];
		delete[] aDist;
	}
	dDistOffset = double(aDistRange[0]);
	dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	aDist = new double *[size];
	for( int i=0; i<size; i++ )
		aDist[i] = new double[nDist];
}